

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>::grow
          (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this,size_t MinSize)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *__ptr;
  undefined8 uVar4;
  uint64_t uVar5;
  void *pvVar6;
  long lVar7;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar5 = NextPowerOf2((ulong)(this->
                              super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>
                              ).super_SmallVectorBase.Capacity + 2);
  if (MinSize < uVar5) {
    MinSize = uVar5;
  }
  if (0xfffffffe < MinSize) {
    MinSize = 0xffffffff;
  }
  pvVar6 = safe_malloc(MinSize << 4);
  pvVar3 = (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
           super_SmallVectorBase.BeginX;
  uVar2 = (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.Size;
  for (lVar7 = 0; (ulong)uVar2 << 4 != lVar7; lVar7 = lVar7 + 0x10) {
    puVar1 = (undefined8 *)((long)pvVar3 + lVar7);
    uVar4 = puVar1[1];
    *(undefined8 *)((long)pvVar6 + lVar7) = *puVar1;
    ((undefined8 *)((long)pvVar6 + lVar7))[1] = uVar4;
  }
  __ptr = (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *)
          (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
  super_SmallVectorBase.BeginX = pvVar6;
  (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
  super_SmallVectorBase.Capacity = (uint)MinSize;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}